

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlat<double,double,double,duckdb::BinaryStandardOperatorWrapper,duckdb::PowOperator,bool,false,false>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *this;
  TemplatedValidityMask<unsigned_long> *count_00;
  Vector *in_RDX;
  idx_t in_RSI;
  ValidityMask *in_RDI;
  ValidityMask *unaff_retaddr;
  idx_t in_stack_00000008;
  double *in_stack_00000010;
  double *in_stack_00000018;
  double *in_stack_00000020;
  ValidityMask *result_validity;
  double *result_data;
  double *rdata;
  double *ldata;
  ValidityMask *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffffb8;
  VectorType vector_type_p;
  TemplatedValidityMask<unsigned_long> *other;
  Vector *in_stack_ffffffffffffffc0;
  undefined1 fun_00;
  
  vector_type_p = (VectorType)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
  FlatVector::GetData<double>((Vector *)0x20b87cb);
  FlatVector::GetData<double>((Vector *)0x20b87da);
  Vector::SetVectorType(in_stack_ffffffffffffffc0,vector_type_p);
  this = (TemplatedValidityMask<unsigned_long> *)FlatVector::GetData<double>((Vector *)0x20b87f5);
  count_00 = &FlatVector::Validity((Vector *)0x20b8804)->super_TemplatedValidityMask<unsigned_long>;
  bVar1 = BinaryStandardOperatorWrapper::AddsNulls();
  if (bVar1) {
    other = count_00;
    FlatVector::Validity((Vector *)0x20b882b);
    TemplatedValidityMask<unsigned_long>::Copy(this,other,(idx_t)count_00);
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(other);
    if (bVar1) {
      FlatVector::Validity((Vector *)0x20b8861);
      fun_00 = (undefined1)((ulong)in_RDI >> 0x38);
      TemplatedValidityMask<unsigned_long>::Copy(this,other,(idx_t)count_00);
    }
    else {
      FlatVector::Validity((Vector *)0x20b8889);
      ValidityMask::Combine(unaff_retaddr,in_RDI,in_RSI);
      fun_00 = (undefined1)((ulong)in_RDI >> 0x38);
    }
  }
  else {
    FlatVector::Validity((Vector *)0x20b88b1);
    FlatVector::SetValidity(in_RDX,in_stack_ffffffffffffff88);
    FlatVector::Validity((Vector *)0x20b88d2);
    ValidityMask::Combine(unaff_retaddr,in_RDI,in_RSI);
    fun_00 = (undefined1)((ulong)in_RDI >> 0x38);
  }
  ExecuteFlatLoop<double,double,double,duckdb::BinaryStandardOperatorWrapper,duckdb::PowOperator,bool,false,false>
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
             (bool)fun_00);
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}